

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O0

short __thiscall TPZGenPartialGrid::Read(TPZGenPartialGrid *this,TPZGeoMesh *grid)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  int64_t iVar1;
  int *piVar2;
  TPZVec<long> *rectangle_nodes;
  int *piVar3;
  long *plVar4;
  TPZGeoMesh *in_RSI;
  long in_RDI;
  int64_t index_2;
  int64_t index_1;
  TPZVec<long> nos;
  int64_t index;
  int j;
  int i;
  TPZVec<double> coor;
  TPZGeoMesh *in_stack_000001d0;
  _func_int **in_stack_fffffffffffffea8;
  TPZGeoMesh *in_stack_fffffffffffffeb0;
  TPZVec<double> *in_stack_fffffffffffffeb8;
  TPZGeoNode *in_stack_fffffffffffffec0;
  long lVar5;
  int64_t in_stack_fffffffffffffec8;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar6;
  undefined8 in_stack_fffffffffffffee8;
  TPZGenPartialGrid *in_stack_fffffffffffffef0;
  TPZGenPartialGrid *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  TPZVec<long> local_78;
  int64_t local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  TPZGeoMesh *local_10;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_38 = 0;
  local_10 = in_RSI;
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)in_stack_fffffffffffffec0,(int64_t)in_stack_fffffffffffffeb8,
             (double *)in_stack_fffffffffffffeb0);
  this_00 = TPZGeoMesh::NodeVec(local_10);
  iVar1 = TPZChunkVector<TPZGeoNode,_10>::NElements(&this_00->super_TPZChunkVector<TPZGeoNode,_10>);
  if (iVar1 < *(long *)(in_RDI + 0xc0)) {
    TPZGeoMesh::NodeVec(local_10);
    TPZAdmChunkVector<TPZGeoNode,_10>::Resize
              ((TPZAdmChunkVector<TPZGeoNode,_10> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar6);
  }
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x20),0);
  local_3c = *piVar2;
  while( true ) {
    iVar6 = local_3c;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x20),1);
    if (*piVar2 + 1 <= iVar6) break;
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x40),0);
    local_40 = *piVar2;
    while( true ) {
      iVar6 = local_40;
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x40),1);
      if (*piVar2 + 1 <= iVar6) break;
      local_48 = NodeIndex((TPZGenPartialGrid *)in_stack_fffffffffffffeb0,
                           (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           (int)in_stack_fffffffffffffea8);
      Coord(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
            (TPZVec<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      TPZGeoMesh::NodeVec(local_10);
      in_stack_ffffffffffffff10 =
           (TPZGenPartialGrid *)
           TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      TPZGeoNode::Initialize
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      local_40 = local_40 + 1;
    }
    local_3c = local_3c + 1;
  }
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffeb0,(int64_t)in_stack_fffffffffffffea8)
  ;
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x20),0);
  local_3c = *piVar2;
  while( true ) {
    iVar6 = local_3c;
    rectangle_nodes = (TPZVec<long> *)TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x20),1);
    if (*(int *)&rectangle_nodes->_vptr_TPZVec <= iVar6) break;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x40),0);
    local_40 = *piVar3;
    while( true ) {
      iVar6 = local_40;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x40),1);
      if (*piVar3 <= iVar6) break;
      local_48 = ElementIndex((TPZGenPartialGrid *)in_stack_fffffffffffffeb0,
                              (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                              (int)in_stack_fffffffffffffea8);
      ElementConnectivity(in_stack_ffffffffffffff10,(int64_t)piVar2,rectangle_nodes);
      if (*(int *)(in_RDI + 200) == 0) {
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0xc])(local_10,3,&local_78,1,local_80);
      }
      else {
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0xc])(local_10,2,&local_78,1,local_88);
        plVar4 = TPZVec<long>::operator[](&local_78,2);
        lVar5 = *plVar4;
        plVar4 = TPZVec<long>::operator[](&local_78,1);
        *plVar4 = lVar5;
        plVar4 = TPZVec<long>::operator[](&local_78,3);
        in_stack_fffffffffffffea8 = (_func_int **)*plVar4;
        in_stack_fffffffffffffeb0 = (TPZGeoMesh *)TPZVec<long>::operator[](&local_78,2);
        ((TPZVec<int> *)&in_stack_fffffffffffffeb0->super_TPZSavable)->_vptr_TPZVec =
             in_stack_fffffffffffffea8;
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0xc])(local_10,2,&local_78,1,local_88);
      }
      local_40 = local_40 + 1;
    }
    local_3c = local_3c + 1;
  }
  TPZGeoMesh::BuildConnectivity(in_stack_000001d0);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffeb0);
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffeb0);
  return 0;
}

Assistant:

short
TPZGenPartialGrid::Read (TPZGeoMesh &grid) {
	
	TPZVec<REAL> coor(2,0.);
	int i,j;
	int64_t index;
	
	if(grid.NodeVec().NElements() < fNumNodes) grid.NodeVec().Resize(fNumNodes);
	for(i=fRangex[0]; i<fRangex[1]+1; i++) {
		for(j = fRangey[0]; j<fRangey[1]+1; j++) {
			index = NodeIndex(i,j);
			Coord(index,coor);
			grid.NodeVec()[index].Initialize(coor,grid);
		}
	}
	//
	//numbering the nodes
	//
	// create the geometric elements (retangular)
	
	TPZVec<int64_t> nos(4);
	for(i=fRangex[0]; i<fRangex[1]; i++) {
		for(j=fRangey[0]; j<fRangey[1]; j++) {
			index = ElementIndex(i,j);
			ElementConnectivity(index,nos);
			if(fElementType == 0) {
				int64_t index;   
				grid.CreateGeoElement(EQuadrilateral,nos,1,index);
			} else {
				int64_t index;   
				grid.CreateGeoElement(ETriangle,nos,1,index);
				nos[1] = nos[2];
				nos[2] = nos[3];
				grid.CreateGeoElement(ETriangle,nos,1,index);
			}
		}
	}
	grid.BuildConnectivity();
	return 0;
	
}